

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

xmlNodePtr
xmlCtxtParseContentInternal
          (xmlParserCtxtPtr ctxt,xmlParserInputPtr input,int hasTextDecl,int buildTree)

{
  xmlChar *pxVar1;
  int iVar2;
  xmlNodePtr value;
  _xmlNode *p_Var3;
  xmlNodePtr pxVar4;
  
  if (buildTree == 0) {
    value = (xmlNodePtr)0x0;
  }
  else {
    value = xmlNewDocNode(ctxt->myDoc,(xmlNsPtr)0x0,(xmlChar *)"#root",(xmlChar *)0x0);
    if (value == (xmlNodePtr)0x0) {
      xmlCtxtErrMemory(ctxt);
      pxVar4 = (xmlNodePtr)0x0;
      value = (xmlNodePtr)0x0;
      goto LAB_0013a7de;
    }
  }
  iVar2 = xmlCtxtPushInput(ctxt,input);
  if (iVar2 < 0) {
    pxVar4 = (xmlNodePtr)0x0;
    goto LAB_0013a7de;
  }
  nameNsPush(ctxt,(xmlChar *)"#root",(xmlChar *)0x0,(xmlChar *)0x0,0,0);
  spacePush(ctxt,-1);
  if (buildTree != 0) {
    nodePush(ctxt,value);
  }
  if (hasTextDecl != 0) {
    xmlDetectEncoding(ctxt);
    pxVar1 = ctxt->input->cur;
    if (((((*pxVar1 == '<') && (pxVar1[1] == '?')) && (pxVar1[2] == 'x')) &&
        ((pxVar1[3] == 'm' && (pxVar1[4] == 'l')))) &&
       (((ulong)pxVar1[5] < 0x21 && ((0x100002600U >> ((ulong)pxVar1[5] & 0x3f) & 1) != 0)))) {
      xmlParseTextDecl(ctxt);
      iVar2 = xmlStrEqual(ctxt->version,"1.0");
      if ((iVar2 != 0) && (iVar2 = xmlStrEqual(ctxt->input->version,"1.0"), iVar2 == 0)) {
        xmlFatalErrMsg(ctxt,XML_ERR_VERSION_MISMATCH,
                       "Version mismatch between document and entity\n");
      }
    }
  }
  xmlParseContentInternal(ctxt);
  if (ctxt->input->cur < ctxt->input->end) {
    xmlFatalErr(ctxt,XML_ERR_NOT_WELL_BALANCED,(char *)0x0);
  }
  if (ctxt->wellFormed == 0) {
    if (ctxt->recovery == 0) goto LAB_0013a797;
    iVar2 = xmlCtxtIsCatastrophicError(ctxt);
    pxVar4 = (xmlNodePtr)0x0;
    if ((value != (xmlNodePtr)0x0) && (iVar2 == 0)) goto LAB_0013a778;
  }
  else if (value == (xmlNodePtr)0x0) {
LAB_0013a797:
    pxVar4 = (xmlNodePtr)0x0;
  }
  else {
LAB_0013a778:
    pxVar4 = value->children;
    value->children = (_xmlNode *)0x0;
    value->last = (_xmlNode *)0x0;
    for (p_Var3 = pxVar4; p_Var3 != (xmlNodePtr)0x0; p_Var3 = p_Var3->next) {
      p_Var3->parent = (_xmlNode *)0x0;
    }
  }
  do {
    ctxt->input->cur = ctxt->input->end;
    xmlParserShrink(ctxt);
    iVar2 = xmlParserGrow(ctxt);
  } while (0 < iVar2);
  if (buildTree != 0) {
    nodePop(ctxt);
  }
  namePop(ctxt);
  spacePop(ctxt);
  xmlCtxtPopInput(ctxt);
LAB_0013a7de:
  xmlFreeNode(value);
  return pxVar4;
}

Assistant:

static xmlNodePtr
xmlCtxtParseContentInternal(xmlParserCtxtPtr ctxt, xmlParserInputPtr input,
                            int hasTextDecl, int buildTree) {
    xmlNodePtr root = NULL;
    xmlNodePtr list = NULL;
    xmlChar *rootName = BAD_CAST "#root";
    int result;

    if (buildTree) {
        root = xmlNewDocNode(ctxt->myDoc, NULL, rootName, NULL);
        if (root == NULL) {
            xmlErrMemory(ctxt);
            goto error;
        }
    }

    if (xmlCtxtPushInput(ctxt, input) < 0)
        goto error;

    nameNsPush(ctxt, rootName, NULL, NULL, 0, 0);
    spacePush(ctxt, -1);

    if (buildTree)
        nodePush(ctxt, root);

    if (hasTextDecl) {
        xmlDetectEncoding(ctxt);

        /*
         * Parse a possible text declaration first
         */
        if ((CMP5(CUR_PTR, '<', '?', 'x', 'm', 'l')) &&
            (IS_BLANK_CH(NXT(5)))) {
            xmlParseTextDecl(ctxt);
            /*
             * An XML-1.0 document can't reference an entity not XML-1.0
             */
            if ((xmlStrEqual(ctxt->version, BAD_CAST "1.0")) &&
                (!xmlStrEqual(ctxt->input->version, BAD_CAST "1.0"))) {
                xmlFatalErrMsg(ctxt, XML_ERR_VERSION_MISMATCH,
                               "Version mismatch between document and "
                               "entity\n");
            }
        }
    }

    xmlParseContentInternal(ctxt);

    if (ctxt->input->cur < ctxt->input->end)
	xmlFatalErr(ctxt, XML_ERR_NOT_WELL_BALANCED, NULL);

    if ((ctxt->wellFormed) ||
        ((ctxt->recovery) && (!xmlCtxtIsCatastrophicError(ctxt)))) {
        if (root != NULL) {
            xmlNodePtr cur;

            /*
             * Unlink newly created node list.
             */
            list = root->children;
            root->children = NULL;
            root->last = NULL;
            for (cur = list; cur != NULL; cur = cur->next)
                cur->parent = NULL;
        }
    }

    /*
     * Read the rest of the stream in case of errors. We want
     * to account for the whole entity size.
     */
    do {
        ctxt->input->cur = ctxt->input->end;
        xmlParserShrink(ctxt);
        result = xmlParserGrow(ctxt);
    } while (result > 0);

    if (buildTree)
        nodePop(ctxt);

    namePop(ctxt);
    spacePop(ctxt);

    xmlCtxtPopInput(ctxt);

error:
    xmlFreeNode(root);

    return(list);
}